

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::refreshSystemChanAssign(Synth *this,Bit8u firstPart,Bit8u lastPart)

{
  ulong uVar1;
  long lVar2;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  memset(this->extensions->chantable,0xff,0x90);
  uVar3 = 0;
  do {
    if (((uVar3 <= (CONCAT71(in_register_00000011,lastPart) & 0xffffffff)) &&
        ((CONCAT71(in_register_00000031,firstPart) & 0xffffffff) <= uVar3)) &&
       (this->parts[uVar3] != (Part *)0x0)) {
      Part::allSoundOff(this->parts[uVar3]);
      Part::resetAllControllers(this->parts[uVar3]);
    }
    uVar1 = (ulong)(this->mt32ram->system).chanAssign[uVar3];
    if (uVar1 < 0x10) {
      lVar2 = 0;
      do {
        if (8 < this->extensions->chantable[uVar1][lVar2]) {
          this->extensions->chantable[uVar1][lVar2] = (Bit8u)uVar3;
          break;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 9);
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 9) {
      return;
    }
  } while( true );
}

Assistant:

void Synth::refreshSystemChanAssign(Bit8u firstPart, Bit8u lastPart) {
	memset(extensions.chantable, 0xFF, sizeof(extensions.chantable));

	// CONFIRMED: In the case of assigning a MIDI channel to multiple parts,
	//            the messages received on that MIDI channel are handled by all the parts.
	for (Bit32u i = 0; i <= 8; i++) {
		if (parts[i] != NULL && i >= firstPart && i <= lastPart) {
			// CONFIRMED: Decay is started for all polys, and all controllers are reset, for every part whose assignment was touched by the sysex write.
			parts[i]->allSoundOff();
			parts[i]->resetAllControllers();
		}
		Bit8u chan = mt32ram.system.chanAssign[i];
		if (chan > 15) continue;
		Bit8u *chanParts = extensions.chantable[chan];
		for (Bit32u j = 0; j <= 8; j++) {
			if (chanParts[j] > 8) {
				chanParts[j] = Bit8u(i);
				break;
			}
		}
	}

#if MT32EMU_MONITOR_SYSEX > 0
	Bit8u *rset = mt32ram.system.chanAssign;
	printDebug(" Part assign:     1=%02d 2=%02d 3=%02d 4=%02d 5=%02d 6=%02d 7=%02d 8=%02d Rhythm=%02d", rset[0], rset[1], rset[2], rset[3], rset[4], rset[5], rset[6], rset[7], rset[8]);
#endif
}